

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::MinMaxState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::MaxOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  sel_t *psVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  long *plVar10;
  ulong uVar11;
  idx_t iVar12;
  byte bVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      uVar11 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar7 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar7 = count;
          }
LAB_012a829b:
          uVar8 = uVar11;
          if (uVar11 < uVar7) {
            bVar13 = state[0x10];
            plVar10 = (long *)(pdVar2 + uVar11 * 0x10 + 8);
            do {
              uVar3 = plVar10[-1];
              lVar5 = *plVar10;
              if ((bVar13 & 1) == 0) {
                *(ulong *)state = uVar3;
                *(long *)(state + 8) = lVar5;
                state[0x10] = '\x01';
                bVar13 = 1;
              }
              else if ((*(long *)(state + 8) < lVar5) ||
                      (*(ulong *)state < uVar3 && *(long *)(state + 8) == lVar5)) {
                *(ulong *)state = uVar3;
                *(long *)(state + 8) = lVar5;
              }
              uVar11 = uVar11 + 1;
              plVar10 = plVar10 + 2;
              uVar8 = uVar7;
            } while (uVar7 != uVar11);
          }
        }
        else {
          uVar3 = puVar1[uVar6];
          uVar7 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar7 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_012a829b;
          uVar8 = uVar7;
          if ((uVar3 != 0) && (uVar8 = uVar11, uVar11 < uVar7)) {
            plVar10 = (long *)(pdVar2 + uVar11 * 0x10 + 8);
            uVar14 = 0;
            do {
              if ((uVar3 >> (uVar14 & 0x3f) & 1) != 0) {
                uVar8 = plVar10[-1];
                lVar5 = *plVar10;
                if (state[0x10] == '\0') {
                  *(ulong *)state = uVar8;
                  *(long *)(state + 8) = lVar5;
                  state[0x10] = '\x01';
                }
                else if ((*(long *)(state + 8) < lVar5) ||
                        (*(ulong *)state < uVar8 && *(long *)(state + 8) == lVar5)) {
                  *(ulong *)state = uVar8;
                  *(long *)(state + 8) = lVar5;
                }
              }
              uVar14 = uVar14 + 1;
              plVar10 = plVar10 + 2;
              uVar8 = uVar7;
            } while (uVar7 - uVar11 != uVar14);
          }
        }
        uVar6 = uVar6 + 1;
        uVar11 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      uVar11 = *(ulong *)input->data;
      uVar6 = *(ulong *)((long)input->data + 8);
      if (state[0x10] == '\0') {
        *(ulong *)state = uVar11;
        *(ulong *)(state + 8) = uVar6;
        state[0x10] = '\x01';
      }
      else if (((long)*(ulong *)(state + 8) < (long)uVar6) ||
              (*(ulong *)state < uVar11 && *(ulong *)(state + 8) == uVar6)) {
        *(ulong *)state = uVar11;
        *(ulong *)(state + 8) = uVar6;
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        bVar13 = state[0x10];
        iVar9 = 0;
        do {
          iVar12 = iVar9;
          if (psVar4 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar4[iVar9];
          }
          uVar11 = *(ulong *)(local_78.data + iVar12 * 0x10);
          lVar5 = *(long *)(local_78.data + iVar12 * 0x10 + 8);
          if ((bVar13 & 1) == 0) {
            *(ulong *)state = uVar11;
            *(long *)(state + 8) = lVar5;
            state[0x10] = '\x01';
            bVar13 = 1;
          }
          else if ((*(long *)(state + 8) < lVar5) ||
                  (*(ulong *)state < uVar11 && *(long *)(state + 8) == lVar5)) {
            *(ulong *)state = uVar11;
            *(long *)(state + 8) = lVar5;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar12 = iVar9;
        if (psVar4 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar4[iVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6]
             >> (iVar12 & 0x3f) & 1) != 0) {
          uVar11 = *(ulong *)(local_78.data + iVar12 * 0x10);
          lVar5 = *(long *)(local_78.data + iVar12 * 0x10 + 8);
          if (state[0x10] == '\0') {
            *(ulong *)state = uVar11;
            *(long *)(state + 8) = lVar5;
            state[0x10] = '\x01';
          }
          else if ((*(long *)(state + 8) < lVar5) ||
                  (*(ulong *)state < uVar11 && *(long *)(state + 8) == lVar5)) {
            *(ulong *)state = uVar11;
            *(long *)(state + 8) = lVar5;
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}